

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::CameraBase::ApproximatedPdxy(CameraBase *this,SurfaceInteraction *si,int samplesPerPixel)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  bool bVar7;
  Point3fi *pPVar8;
  Point3fi *pPVar9;
  Float FVar10;
  Float FVar11;
  Float FVar12;
  float fVar13;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar14;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  float fVar40;
  float z;
  float fVar41;
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar45 [12];
  undefined1 auVar44 [16];
  undefined1 in_ZMM12 [64];
  float fVar46;
  Point3f PVar47;
  Normal3f NVar48;
  Vector3f VVar49;
  Vector3f v_00;
  Transform DownZFromCamera;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  Transform local_d8;
  ulong local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined8 local_38;
  undefined8 uStack_30;
  Vector3f v;
  
  auVar45 = in_ZMM12._4_12_;
  pPVar8 = &(si->super_Interaction).pi;
  pPVar9 = &(si->super_Interaction).pi;
  auVar15._0_4_ =
       (pPVar8->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar15._4_4_ =
       (pPVar8->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar15._8_4_ =
       (pPVar9->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar15._12_4_ =
       (pPVar9->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar36 = *(undefined8 *)
            &(si->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(si->super_Interaction).pi.
                                                super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar18._0_4_ = (float)uVar36 + auVar15._0_4_;
  auVar18._4_4_ = (float)((ulong)uVar36 >> 0x20) + auVar15._4_4_;
  auVar18._8_4_ = auVar15._8_4_ + 0.0;
  auVar18._12_4_ = auVar15._12_4_ + 0.0;
  auVar31._8_4_ = 0x3f000000;
  auVar31._0_8_ = 0x3f0000003f000000;
  auVar31._12_4_ = 0x3f000000;
  auVar15 = vmulps_avx512vl(auVar18,auVar31);
  PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar15._0_8_;
  PVar47.super_Tuple3<pbrt::Point3,_float>.z =
       ((si->super_Interaction).pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (si->super_Interaction).pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  uVar36 = auVar15._8_8_;
  PVar47 = AnimatedTransform::ApplyInverse
                     ((AnimatedTransform *)this,PVar47,(si->super_Interaction).time);
  fVar14 = PVar47.super_Tuple3<pbrt::Point3,_float>.z;
  uVar37 = 0;
  uVar38 = 0;
  uVar39 = 0;
  uVar35 = 0;
  NVar48 = AnimatedTransform::ApplyInverse
                     ((AnimatedTransform *)this,
                      (si->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>,
                      (si->super_Interaction).time);
  auVar21._0_4_ = NVar48.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar16._8_8_ = uVar36;
  auVar16._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
  uStack_f0 = (undefined4)uVar35;
  uStack_ec = (undefined4)((ulong)uVar35 >> 0x20);
  auVar19._0_4_ =
       PVar47.super_Tuple3<pbrt::Point3,_float>.x * PVar47.super_Tuple3<pbrt::Point3,_float>.x;
  auVar19._4_4_ =
       PVar47.super_Tuple3<pbrt::Point3,_float>.y * PVar47.super_Tuple3<pbrt::Point3,_float>.y;
  auVar19._8_4_ = (float)uVar36 * (float)uVar36;
  fVar34 = (float)((ulong)uVar36 >> 0x20);
  auVar19._12_4_ = fVar34 * fVar34;
  auVar15 = vhaddps_avx(auVar19,auVar19);
  auVar15 = ZEXT416((uint)(fVar14 * fVar14 + auVar15._0_4_));
  auVar15 = vsqrtss_avx(auVar15,auVar15);
  fVar34 = auVar15._0_4_;
  auVar20._4_4_ = fVar34;
  auVar20._0_4_ = fVar34;
  auVar20._8_4_ = fVar34;
  auVar20._12_4_ = fVar34;
  VVar49.super_Tuple3<pbrt::Vector3,_float>.z = fVar14 / fVar34;
  auVar15 = vdivps_avx(auVar16,auVar20);
  VVar49.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  RotateFromTo(&local_d8,VVar49,(Vector3f)(ZEXT412(0x3f800000) << 0x40));
  FVar12 = local_d8.mInv.m[2][0];
  FVar11 = local_d8.mInv.m[1][0];
  FVar10 = local_d8.mInv.m[0][0];
  fVar34 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar41 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar43 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar46 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar32._4_4_ = local_d8.mInv.m[0][2];
  auVar32._0_4_ = local_d8.mInv.m[0][1];
  auVar32._8_8_ = 0;
  local_58 = CONCAT44(local_d8.mInv.m[1][2],local_d8.mInv.m[1][1]);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_58;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_58;
  auVar22._4_4_ = local_d8.mInv.m[2][2];
  auVar22._0_4_ = local_d8.mInv.m[2][1];
  auVar22._8_8_ = 0;
  fVar1 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar2 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar3 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar4 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar5 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  local_38._0_4_ = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
  local_38._4_4_ = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_30 = 0;
  fVar6 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar33 = 1.0;
  if (*(char *)(Options + 5) == '\0') {
    auVar24._0_4_ = (float)samplesPerPixel;
    auVar24._4_12_ = auVar45;
    if (auVar24._0_4_ < 0.0) {
      uStack_50 = 0;
      local_48 = auVar32;
      fVar33 = sqrtf(auVar24._0_4_);
      auVar17._8_8_ = uStack_50;
      auVar17._0_8_ = local_58;
      auVar32 = local_48;
    }
    else {
      auVar15 = vsqrtss_avx(auVar24,auVar24);
      fVar33 = auVar15._0_4_;
      auVar17 = auVar23;
    }
    auVar15 = vmaxss_avx(ZEXT416((uint)(1.0 / fVar33)),ZEXT416(0x3e000000));
    fVar33 = auVar15._0_4_;
  }
  auVar27._8_4_ = uStack_f0;
  auVar27._0_8_ = NVar48.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar27._12_4_ = uStack_ec;
  auVar15 = vmovshdup_avx(auVar27);
  auVar28._4_4_ = uVar37;
  auVar28._0_4_ = auVar21._0_4_;
  auVar28._8_4_ = uVar38;
  auVar28._12_4_ = uVar39;
  auVar16 = vmulps_avx512vl(auVar15,auVar17);
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)FVar10),auVar27,ZEXT416((uint)(FVar11 * auVar15._0_4_)));
  auVar44._0_4_ = NVar48.super_Tuple3<pbrt::Normal3,_float>.x;
  auVar44._4_4_ = auVar44._0_4_;
  auVar44._8_4_ = auVar44._0_4_;
  auVar44._12_4_ = auVar44._0_4_;
  auVar15 = vfmadd213ps_fma(auVar44,auVar32,auVar16);
  auVar16 = vfmadd213ss_fma(auVar28,ZEXT416((uint)FVar12),auVar31);
  auVar26._8_8_ = uVar36;
  auVar26._0_8_ = PVar47.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar21._4_4_ = auVar21._0_4_;
  auVar21._8_4_ = auVar21._0_4_;
  auVar21._12_4_ = auVar21._0_4_;
  auVar32 = vfmadd213ps_fma(auVar21,auVar22,auVar15);
  auVar15 = vmovshdup_avx(auVar32);
  auVar31 = vmovshdup_avx(auVar26);
  fVar13 = auVar31._0_4_;
  auVar17 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[3][0]),auVar26,
                                ZEXT416((uint)(fVar13 * local_d8.m.m[3][1])));
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)local_d8.m.m[0][0]),auVar26,
                            ZEXT416((uint)(fVar13 * local_d8.m.m[0][1])));
  auVar18 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[2][0]),auVar26,
                                ZEXT416((uint)(fVar13 * local_d8.m.m[2][1])));
  auVar19 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[1][0]),auVar26,
                                ZEXT416((uint)(fVar13 * local_d8.m.m[1][1])));
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)local_d8.m.m[0][2]),ZEXT416((uint)fVar14),auVar31);
  auVar17 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[3][2]),ZEXT416((uint)fVar14),auVar17);
  auVar19 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[1][2]),ZEXT416((uint)fVar14),auVar19);
  auVar18 = vfmadd213ss_avx512f(ZEXT416((uint)local_d8.m.m[2][2]),ZEXT416((uint)fVar14),auVar18);
  fVar6 = fVar6 + 1.0;
  auVar17 = vaddss_avx512f(ZEXT416((uint)local_d8.m.m[3][3]),auVar17);
  fVar14 = local_d8.m.m[0][3] + auVar31._0_4_;
  fVar40 = auVar17._0_4_;
  bVar7 = fVar40 == 1.0;
  fVar13 = (float)((uint)bVar7 * (int)fVar14 + (uint)!bVar7 * (int)(fVar14 / fVar40));
  fVar14 = local_d8.m.m[1][3] + auVar19._0_4_;
  fVar14 = (float)((uint)bVar7 * (int)fVar14 + (uint)!bVar7 * (int)(fVar14 / fVar40));
  auVar18 = vaddss_avx512f(ZEXT416((uint)local_d8.m.m[2][3]),auVar18);
  auVar29 = ZEXT816(0) << 0x20;
  auVar19 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar29);
  auVar20 = vaddss_avx512f(ZEXT416((uint)fVar2),auVar29);
  auVar21 = vaddss_avx512f(ZEXT416((uint)fVar5),auVar29);
  auVar22 = vaddss_avx512f(ZEXT416((uint)fVar1),auVar29);
  auVar23 = vaddss_avx512f(ZEXT416((uint)fVar4),auVar29);
  auVar24 = vaddss_avx512f(ZEXT416((uint)fVar43),auVar29);
  fVar43 = auVar15._0_4_;
  auVar17 = ZEXT416((uint)(fVar43 * auVar19._0_4_));
  auVar31 = vfmadd213ss_fma(auVar20,auVar32,auVar17);
  auVar17 = vfmsub231ss_fma(auVar17,auVar15,auVar19);
  auVar25._0_4_ =
       (float)((uint)bVar7 * (int)auVar18._0_4_ + (uint)!bVar7 * (int)(auVar18._0_4_ / fVar40));
  auVar25._4_12_ = auVar18._4_12_;
  auVar18 = vaddss_avx512f(ZEXT416((uint)fVar41),auVar29);
  auVar26 = vmulss_avx512f(auVar25,auVar15);
  auVar27 = vaddss_avx512f(ZEXT416((uint)fVar34),auVar29);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar31._0_4_ + auVar17._0_4_)),auVar16,auVar22);
  auVar29 = vaddss_avx512f(ZEXT416((uint)fVar46),auVar29);
  auVar31 = vfmadd213ss_fma(ZEXT416((uint)fVar14),auVar32,auVar26);
  auVar26 = vfmsub231ss_avx512f(auVar26,auVar15,auVar25);
  auVar26 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar31._0_4_ + auVar26._0_4_)),auVar16,
                                ZEXT416((uint)fVar13));
  auVar30 = vfmadd213ss_avx512f(auVar21,auVar32,ZEXT416((uint)(fVar43 * fVar6)));
  auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar43 * fVar6)),auVar15,ZEXT416((uint)fVar6));
  auVar31 = vaddss_avx512f(auVar30,auVar31);
  auVar31 = vfmadd231ss_fma(auVar31,auVar16,auVar23);
  auVar17 = vxorps_avx512vl(ZEXT416((uint)(auVar17._0_4_ - auVar26._0_4_)),auVar28);
  fVar46 = auVar17._0_4_ / auVar31._0_4_;
  auVar42._0_4_ = (float)local_38 + 0.0;
  auVar42._4_4_ = local_38._4_4_ + 1.0;
  auVar42._8_4_ = (float)uStack_30 + 0.0;
  auVar42._12_4_ = uStack_30._4_4_ + 0.0;
  auVar31 = ZEXT416((uint)(fVar43 * auVar24._0_4_));
  auVar17 = vfmadd213ss_fma(auVar18,auVar32,auVar31);
  auVar15 = vfmsub231ss_fma(auVar31,auVar15,auVar24);
  auVar31 = vmovshdup_avx(auVar42);
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(auVar17._0_4_ + auVar15._0_4_)),auVar16,auVar27);
  auVar30 = ZEXT416((uint)(fVar43 * auVar31._0_4_));
  auVar15 = vxorps_avx512vl(auVar30,auVar28);
  auVar15 = vinsertps_avx(auVar30,auVar15,0x10);
  auVar15 = vfmadd231ps_fma(auVar15,auVar42,auVar32);
  auVar15 = vhaddps_avx(auVar15,auVar15);
  auVar32 = vxorps_avx512vl(ZEXT416((uint)(auVar17._0_4_ - auVar26._0_4_)),auVar28);
  auVar15 = vfmadd231ss_fma(auVar15,auVar29,auVar16);
  fVar34 = auVar32._0_4_ / auVar15._0_4_;
  auVar32 = vsubss_avx512f(ZEXT416((uint)(auVar27._0_4_ + auVar29._0_4_ * fVar34)),
                           ZEXT416((uint)fVar13));
  auVar15 = vsubss_avx512f(ZEXT416((uint)(auVar18._0_4_ + auVar42._0_4_ * fVar34)),
                           ZEXT416((uint)fVar14));
  fVar41 = auVar15._0_4_;
  auVar16 = vsubss_avx512f(ZEXT416((uint)(auVar24._0_4_ + auVar31._0_4_ * fVar34)),auVar25);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * local_d8.mInv.m[0][1])),auVar32,
                            ZEXT416((uint)local_d8.mInv.m[0][0]));
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * local_d8.mInv.m[1][1])),auVar32,
                            ZEXT416((uint)local_d8.mInv.m[1][0]));
  auVar15 = vfmadd231ss_fma(auVar15,auVar16,ZEXT416((uint)local_d8.mInv.m[0][2]));
  auVar31 = vfmadd231ss_fma(auVar31,auVar16,ZEXT416((uint)local_d8.mInv.m[1][2]));
  auVar15 = vinsertps_avx(auVar15,auVar31,0x10);
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * local_d8.mInv.m[2][1])),auVar32,
                            ZEXT416((uint)local_d8.mInv.m[2][0]));
  auVar31 = vfmadd231ss_fma(auVar31,auVar16,ZEXT416((uint)local_d8.mInv.m[2][2]));
  v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  v.super_Tuple3<pbrt::Vector3,_float>.z = auVar31._0_4_;
  uVar36 = auVar15._8_8_;
  VVar49 = AnimatedTransform::operator()((AnimatedTransform *)this,v,(si->super_Interaction).time);
  auVar29._0_4_ = fVar33 * VVar49.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar29._4_4_ = fVar33 * VVar49.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar29._8_4_ = fVar33 * (float)uVar36;
  auVar29._12_4_ = fVar33 * (float)((ulong)uVar36 >> 0x20);
  uVar36 = vmovlps_avx(auVar29);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar36 >> 0x20);
  (si->dpdx).super_Tuple3<pbrt::Vector3,_float>.z =
       fVar33 * VVar49.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar13 = (auVar23._0_4_ * fVar46 + auVar22._0_4_) - fVar13;
  fVar14 = (auVar20._0_4_ + auVar21._0_4_ * fVar46) - fVar14;
  fVar34 = (auVar19._0_4_ + fVar46 * fVar6) - auVar25._0_4_;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_d8.mInv.m[0][1])),ZEXT416((uint)fVar13),
                            ZEXT416((uint)local_d8.mInv.m[0][0]));
  auVar31 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_d8.mInv.m[1][1])),ZEXT416((uint)fVar13),
                            ZEXT416((uint)local_d8.mInv.m[1][0]));
  auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * local_d8.mInv.m[2][1])),ZEXT416((uint)fVar13),
                            ZEXT416((uint)local_d8.mInv.m[2][0]));
  auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar34),ZEXT416((uint)local_d8.mInv.m[0][2]));
  auVar31 = vfmadd231ss_fma(auVar31,ZEXT416((uint)fVar34),ZEXT416((uint)local_d8.mInv.m[1][2]));
  auVar32 = vfmadd231ss_fma(auVar32,ZEXT416((uint)fVar34),ZEXT416((uint)local_d8.mInv.m[2][2]));
  auVar15 = vinsertps_avx(auVar15,auVar31,0x10);
  v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar15._0_8_;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = auVar32._0_4_;
  uVar36 = auVar15._8_8_;
  VVar49 = AnimatedTransform::operator()
                     ((AnimatedTransform *)this,v_00,(si->super_Interaction).time);
  auVar30._0_4_ = VVar49.super_Tuple3<pbrt::Vector3,_float>.x * fVar33;
  auVar30._4_4_ = VVar49.super_Tuple3<pbrt::Vector3,_float>.y * fVar33;
  auVar30._8_4_ = (float)uVar36 * fVar33;
  auVar30._12_4_ = (float)((ulong)uVar36 >> 0x20) * fVar33;
  uVar36 = vmovlps_avx(auVar30);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar36 >> 0x20);
  (si->dpdy).super_Tuple3<pbrt::Vector3,_float>.z =
       VVar49.super_Tuple3<pbrt::Vector3,_float>.z * fVar33;
  return;
}

Assistant:

void CameraBase::ApproximatedPdxy(SurfaceInteraction &si, int samplesPerPixel) const {
    // Compute tangent plane equation for ray differential intersections
    Point3f pCamera = CameraFromRender(si.p(), si.time);
    Normal3f nCamera = CameraFromRender(si.n, si.time);
    Transform DownZFromCamera =
        RotateFromTo(Normalize(Vector3f(pCamera)), Vector3f(0, 0, 1));
    Point3f pDownZ = DownZFromCamera(pCamera);
    Normal3f nDownZ = DownZFromCamera(nCamera);
    Float d = Dot(nDownZ, Vector3f(pDownZ));

    // Find intersection points for approximated camera differential rays
    Ray xRay(Point3f(0, 0, 0) + minPosDifferentialX,
             Vector3f(0, 0, 1) + minDirDifferentialX);
    Float tx = -(Dot(nDownZ, Vector3f(xRay.o)) - d) / Dot(nDownZ, xRay.d);
    Ray yRay(Point3f(0, 0, 0) + minPosDifferentialY,
             Vector3f(0, 0, 1) + minDirDifferentialY);
    Float ty = -(Dot(nDownZ, Vector3f(yRay.o)) - d) / Dot(nDownZ, yRay.d);
    Point3f px = xRay(tx), py = yRay(ty);

    // Estimate $\dpdx$ and $\dpdy$ in tangent plane at intersection point
    Float sppScale = GetOptions().disablePixelJitter
                         ? 1
                         : std::max<Float>(.125, 1 / std::sqrt((Float)samplesPerPixel));
    si.dpdx =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(px - pDownZ), si.time);
    si.dpdy =
        sppScale * RenderFromCamera(DownZFromCamera.ApplyInverse(py - pDownZ), si.time);
}